

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void hash_table_clear(hash_table_t *table)

{
  hash_table_bucket_t *phVar1;
  hash_table_bucket_t *local_28;
  hash_table_bucket_t *b;
  hash_table_bucket_t *c;
  uint i;
  hash_table_t *table_local;
  
  for (c._4_4_ = 0; c._4_4_ < table->n_buckets; c._4_4_ = c._4_4_ + 1) {
    local_28 = table->buckets[c._4_4_].next;
    while (local_28 != (hash_table_bucket_t *)0x0) {
      phVar1 = local_28->next;
      local_28->next = table->free_buckets;
      local_28->data = (void *)0x0;
      table->free_buckets = local_28;
      local_28 = phVar1;
    }
    table->buckets[c._4_4_].next = (hash_table_bucket_t *)0x0;
    table->buckets[c._4_4_].data = (void *)0x0;
  }
  table->n_items = 0;
  return;
}

Assistant:

void hash_table_clear( hash_table_t * table )
{
    unsigned i;
    /* return all blocks to the free list */
    for ( i = 0; i < table->n_buckets; ++i ) {
        hash_table_bucket_t *c, * b = table->buckets[i].next;
        while (b) {
           c = b->next;
           b->next = table->free_buckets;
           b->data = NULL;
           table->free_buckets = b;
           b = c; 
        }
        table->buckets[i].next = NULL;
        table->buckets[i].data = NULL;
    }
    table->n_items = 0;
}